

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int rebuild_ch_inner(ptls_buffer_t *buf,uint8_t *src,uint8_t *end,st_ptls_client_hello_t *outer_ch,
                    uint8_t *outer_ext,uint8_t *outer_ext_end)

{
  uint8_t uVar1;
  uint8_t uVar2;
  size_t sVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  uint8_t *puVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  size_t sVar15;
  byte *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  iVar8 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar8 != 0) {
    return iVar8;
  }
  buf->base[buf->off] = '\x01';
  buf->off = buf->off + 1;
  local_40 = outer_ext;
  local_38 = outer_ext_end;
  iVar8 = ptls_buffer_reserve_aligned(buf,3,'\0');
  if (iVar8 != 0) {
    return iVar8;
  }
  puVar11 = buf->base;
  sVar15 = buf->off;
  puVar11[sVar15 + 2] = '\0';
  puVar11 = puVar11 + sVar15;
  puVar11[0] = '\0';
  puVar11[1] = '\0';
  sVar15 = buf->off;
  buf->off = sVar15 + 3;
  if ((long)end - (long)src < 2) {
    return 0x32;
  }
  uVar1 = *src;
  uVar2 = src[1];
  iVar8 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar8 != 0) {
    return iVar8;
  }
  puVar11 = buf->base;
  sVar3 = buf->off;
  puVar11[sVar3] = uVar1;
  puVar11[sVar3 + 1] = uVar2;
  buf->off = buf->off + 2;
  if (0x1f < (long)end - (long)(src + 2)) {
    iVar8 = ptls_buffer_reserve_aligned(buf,0x20,'\0');
    if (iVar8 != 0) {
      return iVar8;
    }
    uVar5 = *(undefined8 *)(src + 10);
    uVar6 = *(undefined8 *)(src + 0x12);
    uVar7 = *(undefined8 *)(src + 0x1a);
    puVar11 = buf->base + buf->off;
    *(undefined8 *)puVar11 = *(undefined8 *)(src + 2);
    *(undefined8 *)(puVar11 + 8) = uVar5;
    *(undefined8 *)(puVar11 + 0x10) = uVar6;
    *(undefined8 *)(puVar11 + 0x18) = uVar7;
    buf->off = buf->off + 0x20;
    if (src + 0x22 != end) {
      local_48 = src + 0x23;
      uVar13 = (long)end - (long)local_48;
      if (src[0x22] <= uVar13) {
        if (src[0x22] != 0) {
          return 0x2f;
        }
        iVar8 = ptls_buffer_reserve_aligned(buf,1,'\0');
        if (iVar8 != 0) {
          return iVar8;
        }
        buf->base[buf->off] = '\0';
        sVar3 = buf->off;
        sVar9 = sVar3 + 1;
        buf->off = sVar9;
        iVar8 = ptls_buffer__do_pushv
                          (buf,(outer_ch->legacy_session_id).base,(outer_ch->legacy_session_id).len)
        ;
        if (iVar8 != 0) {
          return iVar8;
        }
        uVar10 = buf->off - sVar9;
        if (0xff < uVar10) {
          return 0x20c;
        }
        buf->base[sVar3] = (uint8_t)uVar10;
        if (1 < uVar13) {
          uVar13 = (ulong)(ushort)(*(ushort *)(src + 0x23) << 8 | *(ushort *)(src + 0x23) >> 8);
          puVar11 = src + 0x25;
          if (uVar13 <= (ulong)((long)end - (long)puVar11)) {
            iVar8 = ptls_buffer_reserve_aligned(buf,2,'\0');
            if (iVar8 != 0) {
              return iVar8;
            }
            puVar4 = buf->base;
            sVar3 = buf->off;
            (puVar4 + sVar3)[0] = '\0';
            (puVar4 + sVar3)[1] = '\0';
            sVar3 = buf->off;
            buf->off = sVar3 + 2;
            iVar8 = ptls_buffer__do_pushv(buf,puVar11,uVar13);
            if (iVar8 != 0) {
              return iVar8;
            }
            uVar10 = buf->off - (sVar3 + 2);
            if (uVar10 < 0x10000) {
              pbVar14 = puVar11 + uVar13;
              buf->base[sVar3] = (uint8_t)(uVar10 >> 8);
              buf->base[sVar3 + 1] = (uint8_t)uVar10;
              if (pbVar14 == end) {
                return 0x32;
              }
              uVar13 = (ulong)*pbVar14;
              pbVar14 = pbVar14 + 1;
              if ((ulong)((long)end - (long)pbVar14) < uVar13) {
                return 0x32;
              }
              iVar8 = ptls_buffer_reserve_aligned(buf,1,'\0');
              if (iVar8 != 0) {
                return iVar8;
              }
              buf->base[buf->off] = '\0';
              sVar3 = buf->off;
              sVar9 = sVar3 + 1;
              buf->off = sVar9;
              iVar8 = ptls_buffer__do_pushv(buf,pbVar14,uVar13);
              if (iVar8 != 0) {
                return iVar8;
              }
              uVar10 = buf->off - sVar9;
              if (uVar10 < 0x100) {
                local_48 = pbVar14 + uVar13;
                buf->base[sVar3] = (uint8_t)uVar10;
                iVar8 = rebuild_ch_inner_extensions(buf,&local_48,end,local_40,local_38);
                if (iVar8 != 0) {
                  return iVar8;
                }
                uVar13 = buf->off - (sVar15 + 3);
                if (uVar13 < 0x1000000) {
                  lVar12 = 0x10;
                  do {
                    buf->base[sVar15] = (uint8_t)(uVar13 >> ((byte)lVar12 & 0x3f));
                    lVar12 = lVar12 + -8;
                    sVar15 = sVar15 + 1;
                  } while (lVar12 != -8);
                  while( true ) {
                    if (local_48 == end) {
                      return 0;
                    }
                    if (*local_48 != 0) break;
                    local_48 = local_48 + 1;
                  }
                  return 0x2f;
                }
                return 0x20c;
              }
            }
            return 0x20c;
          }
        }
      }
    }
  }
  return 0x32;
}

Assistant:

static int rebuild_ch_inner(ptls_buffer_t *buf, const uint8_t *src, const uint8_t *const end,
                            struct st_ptls_client_hello_t *outer_ch, const uint8_t *outer_ext, const uint8_t *outer_ext_end)
{
#define COPY_BLOCK(capacity)                                                                                                       \
    do {                                                                                                                           \
        ptls_decode_open_block(src, end, (capacity), {                                                                             \
            ptls_buffer_push_block(buf, (capacity), { ptls_buffer_pushv(buf, src, end - src); });                                  \
            src = end;                                                                                                             \
        });                                                                                                                        \
    } while (0)

    int ret;

    ptls_buffer_push_message_body(buf, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        { /* legacy_version */
            uint16_t legacy_version;
            if ((ret = ptls_decode16(&legacy_version, &src, end)) != 0)
                goto Exit;
            ptls_buffer_push16(buf, legacy_version);
        }

        /* hello random */
        if (end - src < PTLS_HELLO_RANDOM_SIZE) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ptls_buffer_pushv(buf, src, PTLS_HELLO_RANDOM_SIZE);
        src += PTLS_HELLO_RANDOM_SIZE;

        ptls_decode_open_block(src, end, 1, {
            if (src != end) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        });
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, outer_ch->legacy_session_id.base, outer_ch->legacy_session_id.len); });

        /* cipher-suites and legacy-compression-methods */
        COPY_BLOCK(2);
        COPY_BLOCK(1);

        /* extensions */
        if ((ret = rebuild_ch_inner_extensions(buf, &src, end, outer_ext, outer_ext_end)) != 0)
            goto Exit;
    });

    /* padding must be all zero */
    for (; src != end; ++src) {
        if (*src != '\0') {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

Exit:
    return ret;

#undef COPY_BLOCK
}